

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<vector<int>_> * __thiscall
vector<vector<int>_>::operator=(vector<vector<int>_> *this,vector<vector<int>_> *other)

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  vector<int> *this_00;
  long lVar4;
  
  this->_size = other->_size;
  lVar3 = (long)other->_capacity;
  this->_capacity = other->_capacity;
  uVar2 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar2 = lVar3 * 0x10 + 8;
  }
  plVar1 = (long *)operator_new__(uVar2);
  *plVar1 = lVar3;
  if (lVar3 != 0) {
    lVar4 = 0;
    this_00 = (vector<int> *)(plVar1 + 1);
    do {
      vector<int>::vector(this_00);
      lVar4 = lVar4 + -0x10;
      this_00 = this_00 + 1;
    } while (-lVar4 != lVar3 * 0x10);
  }
  this->vect = (vector<int> *)(plVar1 + 1);
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < this->_size; lVar3 = lVar3 + 1) {
    vector<int>::operator=
              ((vector<int> *)((long)&this->vect->vect + lVar4),
               (vector<int> *)((long)&other->vect->vect + lVar4));
    lVar4 = lVar4 + 0x10;
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }